

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

void __thiscall
CVmObjBigNum::encode_ber(CVmObjBigNum *this,char *buf,size_t buflen,size_t *outlen,int *ov)

{
  undefined1 uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  char *ext;
  ulong *in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  uint *in_R8;
  bool bVar5;
  char tmpc;
  int j;
  int i;
  ulong rem;
  int z;
  char *tmp;
  uint thdl;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar6;
  undefined1 local_48;
  unsigned_long *in_stack_ffffffffffffffd0;
  
  uVar3 = get_neg(*(char **)(in_RDI + 8));
  iVar4 = (int)((ulong)in_RDI >> 0x20);
  *in_R8 = uVar3;
  *in_RCX = 0;
  get_prec((char *)0x316703);
  ext = alloc_temp_reg(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (uint *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  copy_val((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
           (char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),iVar4);
  while( true ) {
    iVar4 = is_zero(ext);
    bVar5 = false;
    if (iVar4 == 0) {
      bVar5 = *in_RCX < in_RDX;
    }
    if (!bVar5) break;
    div_by_long((char *)in_RCX,(unsigned_long)in_R8,in_stack_ffffffffffffffd0);
    uVar2 = *in_RCX;
    *in_RCX = uVar2 + 1;
    *(undefined1 *)(in_RSI + uVar2) = local_48;
  }
  release_temp_reg(0);
  *in_R8 = (uint)((iVar4 != 0 ^ 0xffU) & 1) | *in_R8;
  if (*in_RCX == 0) {
    uVar2 = *in_RCX;
    *in_RCX = uVar2 + 1;
    *(undefined1 *)(in_RSI + uVar2) = 0;
  }
  iVar4 = (int)*in_RCX;
  for (iVar6 = 0; iVar4 = iVar4 + -1, iVar6 < iVar4; iVar6 = iVar6 + 1) {
    uVar1 = *(undefined1 *)(in_RSI + iVar6);
    *(undefined1 *)(in_RSI + iVar6) = *(undefined1 *)(in_RSI + iVar4);
    *(undefined1 *)(in_RSI + iVar4) = uVar1;
  }
  for (iVar4 = 0; iVar4 < (int)*in_RCX + -1; iVar4 = iVar4 + 1) {
    *(byte *)(in_RSI + iVar4) = *(byte *)(in_RSI + iVar4) | 0x80;
  }
  return;
}

Assistant:

void CVmObjBigNum::encode_ber(char *buf, size_t buflen, size_t &outlen,
                              int &ov)
{
    /* BER can only store unsigned integers */
    ov = get_neg(ext_);

    /* clear the output buffer */
    outlen = 0;

    /* make a temporary copy of the value in a temp register */
    uint thdl;
    char *tmp = alloc_temp_reg(get_prec(ext_), &thdl);
    copy_val(tmp, ext_, FALSE);

    /* keep going until the number is zero or we run out of space */
    int z;
    while (!(z = is_zero(tmp)) && outlen < buflen)
    {
        /* get the low-order 7 bits by getting the remainder mod 128 */
        ulong rem;
        div_by_long(tmp, 128, &rem);
        
        /* store it */
        buf[outlen++] = (char)rem;
    }

    /* release the temporary register */
    release_temp_reg(thdl);

    /* if we ran out of buffer before we ran out of digits, we overflowed */
    ov |= (!z);

    /* if we wrote nothing, write a trivial zero value */
    if (outlen == 0)
        buf[outlen++] = 0;

    /* 
     *   We stored the bytes from least significant to most significant, but
     *   the standard format is the other way around.  Reverse the bytes.  
     */
    int i, j;
    for (i = 0, j = (int)outlen - 1 ; i < j ; ++i, --j)
    {
        char tmpc = buf[i];
        buf[i] = buf[j];
        buf[j] = tmpc;
    }

    /* set the high bit in every byte except the last one */
    for (i = 0 ; i < (int)outlen - 1 ; ++i)
        buf[i] |= 0x80;
}